

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O3

double * u_mass_matrix(int n)

{
  double dVar1;
  double *t;
  double *w;
  double *b;
  double *a;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  uint n_00;
  ulong uVar7;
  
  n_00 = n + 1;
  uVar7 = (ulong)n_00;
  uVar6 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar6 = uVar7 * 8;
  }
  t = (double *)operator_new__(uVar6);
  w = (double *)operator_new__(uVar6);
  u_quadrature_rule(n_00,t,w);
  b = u_polynomial(n_00,n,t);
  a = (double *)operator_new__((ulong)(n_00 * n_00) << 3);
  if (n < 0) {
    pdVar2 = r8mat_mm_new(n_00,n_00,n_00,a,b);
    if (b == (double *)0x0) goto LAB_001be255;
  }
  else {
    uVar6 = 0;
    pdVar2 = b;
    pdVar3 = a;
    do {
      dVar1 = w[uVar6];
      uVar5 = 0;
      pdVar4 = pdVar2;
      do {
        pdVar3[uVar5] = *pdVar4 * dVar1;
        uVar5 = uVar5 + 1;
        pdVar4 = pdVar4 + uVar7;
      } while (uVar7 != uVar5);
      uVar6 = uVar6 + 1;
      pdVar3 = pdVar3 + uVar7;
      pdVar2 = pdVar2 + 1;
    } while (uVar6 != uVar7);
    pdVar2 = r8mat_mm_new(n_00,n_00,n_00,a,b);
  }
  operator_delete__(b);
LAB_001be255:
  operator_delete__(a);
  operator_delete__(w);
  operator_delete__(t);
  return pdVar2;
}

Assistant:

double *u_mass_matrix ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    U_MASS_MATRIX computes the mass matrix for the Chebyshev U polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 July 2015
//
//  Author:
//
//    John Burkardt
//
{
  double *a;
  int i;
  int k;
  double *phi;
  double *phiw;
  double *w;
  double *x;

  x = new double[n+1];
  w = new double[n+1];

  u_quadrature_rule ( n + 1, x, w );

  phi = u_polynomial ( n + 1, n, x );

  phiw = new double[(n+1)*(n+1)];

  for ( k = 0; k <= n; k++ )
  {
    for ( i = 0; i <= n; i++ )
    {
      phiw[i+k*(n+1)] = w[k] * phi[k+i*(n+1)];
    }
  }

  a = r8mat_mm_new ( n + 1, n + 1, n + 1, phiw, phi );
//
//  Free memory.
//
  delete [] phi;
  delete [] phiw;
  delete [] w;
  delete [] x;

  return a;
}